

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void * google::protobuf::Arena::CopyConstruct<proto2_unittest::TestConflictingSymbolNames_Data4>
                 (Arena *arena,void *from)

{
  TestConflictingSymbolNames_Data4 *this;
  
  if (arena == (Arena *)0x0) {
    this = (TestConflictingSymbolNames_Data4 *)operator_new(0x30);
  }
  else {
    this = (TestConflictingSymbolNames_Data4 *)Allocate(arena,0x30);
  }
  proto2_unittest::TestConflictingSymbolNames_Data4::TestConflictingSymbolNames_Data4
            (this,arena,(TestConflictingSymbolNames_Data4 *)from);
  return this;
}

Assistant:

PROTOBUF_NOINLINE void* PROTOBUF_NONNULL Arena::CopyConstruct(
    Arena* PROTOBUF_NULLABLE arena, const void* PROTOBUF_NONNULL from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}